

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

SelectionFlags __thiscall
QAbstractItemView::selectionCommand(QAbstractItemView *this,QModelIndex *index,QEvent *event)

{
  short sVar1;
  SelectionBehavior SVar2;
  QAbstractItemViewPrivate *this_00;
  bool bVar3;
  char cVar4;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> QVar5;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> QVar6;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> QVar7;
  bool bVar8;
  
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar8 = true;
  if ((event != (QEvent *)0x0) && (((byte)event[0xf] & 0x20) != 0)) {
    bVar8 = ((byte)event[0x23] & 4) == 0;
  }
  QVar7.i = 0;
  switch(this_00->selectionMode) {
  case SingleSelection:
    break;
  case MultiSelection:
    QVar5.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QAbstractItemViewPrivate::multiSelectionCommand(this_00,index,event);
    return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           QVar5.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
  case ExtendedSelection:
    QVar5.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QAbstractItemViewPrivate::extendedSelectionCommand(this_00,index,event);
    return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           QVar5.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
  case ContiguousSelection:
    QVar5.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QAbstractItemViewPrivate::contiguousSelectionCommand(this_00,index,event);
    return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           QVar5.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
  default:
    goto switchD_004ea295_default;
  }
  if (event == (QEvent *)0x0) {
LAB_004ea352:
    SVar2 = this_00->selectionBehavior;
    QVar6.i = (uint)(SVar2 == SelectColumns) << 6 | 3;
    QVar7.i = 0x23;
  }
  else {
    sVar1 = *(short *)(event + 8);
    if (sVar1 != 6) {
      if (sVar1 != 3) {
        if ((sVar1 == 2) && (this_00->pressedAlreadySelected != false)) {
          return (SelectionFlags)0;
        }
        goto LAB_004ea352;
      }
      bVar3 = QModelIndex::isValid(index);
      if (!bVar3) {
        return (SelectionFlags)0;
      }
    }
    if ((bVar8) ||
       (cVar4 = QItemSelectionModel::isSelected((QModelIndex *)(this_00->selectionModel).wp.value),
       cVar4 == '\0')) goto LAB_004ea352;
    SVar2 = this_00->selectionBehavior;
    QVar6.i = (uint)(SVar2 == SelectColumns) << 6 | 4;
    QVar7.i = 0x24;
  }
  if (SVar2 != SelectRows) {
    QVar7.i = QVar6.i;
  }
switchD_004ea295_default:
  return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
         (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)QVar7.i;
}

Assistant:

QItemSelectionModel::SelectionFlags QAbstractItemView::selectionCommand(const QModelIndex &index,
                                                                        const QEvent *event) const
{
    Q_D(const QAbstractItemView);
    Qt::KeyboardModifiers keyModifiers = event && event->isInputEvent()
                                       ? static_cast<const QInputEvent*>(event)->modifiers()
                                       : Qt::NoModifier;
    switch (d->selectionMode) {
        case NoSelection: // Never update selection model
            return QItemSelectionModel::NoUpdate;
        case SingleSelection: // ClearAndSelect on valid index otherwise NoUpdate
            if (event) {
                switch (event->type()) {
                case QEvent::MouseButtonPress:
                    // press with any modifiers on a selected item does nothing
                    if (d->pressedAlreadySelected)
                        return QItemSelectionModel::NoUpdate;
                    break;
                case QEvent::MouseButtonRelease:
                    // clicking into area with no items does nothing
                    if (!index.isValid())
                        return QItemSelectionModel::NoUpdate;
                    Q_FALLTHROUGH();
                case QEvent::KeyPress:
                    // ctrl-release on selected item deselects
                    if ((keyModifiers & Qt::ControlModifier) && d->selectionModel->isSelected(index))
                        return QItemSelectionModel::Deselect | d->selectionBehaviorFlags();
                    break;
                default:
                    break;
                }
            }
            return QItemSelectionModel::ClearAndSelect | d->selectionBehaviorFlags();
        case MultiSelection:
            return d->multiSelectionCommand(index, event);
        case ExtendedSelection:
            return d->extendedSelectionCommand(index, event);
        case ContiguousSelection:
            return d->contiguousSelectionCommand(index, event);
    }
    return QItemSelectionModel::NoUpdate;
}